

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_implode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pArray;
  char *zString;
  ulong uVar1;
  bool bVar2;
  int nLen;
  jx9_context *local_58;
  undefined4 local_50;
  char *local_48;
  int local_40;
  ulong local_3c;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    local_50 = 0;
    local_3c = 1;
    bVar2 = ((*apArg)->iFlags & 0x40) != 0;
    local_58 = pCtx;
    if (bVar2) {
      local_40 = 0;
      local_48 = (char *)0x0;
    }
    else {
      local_48 = jx9_value_to_string(*apArg,&local_40);
    }
    jx9_result_string(pCtx,"",0);
    for (uVar1 = (ulong)!bVar2; uVar1 < (uint)nArg; uVar1 = uVar1 + 1) {
      pArray = apArg[uVar1];
      if ((pArray->iFlags & 0x40) == 0) {
        zString = jx9_value_to_string(pArray,&nLen);
        if (0 < nLen) {
          if (0 < local_40) {
            if ((int)local_3c == 0) {
              jx9_result_string(pCtx,local_48,local_40);
            }
            else {
              local_3c = local_3c & 0xffffffff00000000;
            }
          }
          jx9_result_string(pCtx,zString,nLen);
        }
      }
      else {
        jx9_array_walk(pArray,implode_callback,&local_58);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_implode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	struct implode_data imp_data;
	int i = 1;
	if( nArg < 1 ){
		/* Missing argument, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Prepare the implode context */
	imp_data.pCtx = pCtx;
	imp_data.bRecursive = 0;
	imp_data.bFirst = 1;
	imp_data.nRecCount = 0;
	if( !jx9_value_is_json_array(apArg[0]) ){
		imp_data.zSep = jx9_value_to_string(apArg[0], &imp_data.nSeplen);
	}else{
		imp_data.zSep = 0;
		imp_data.nSeplen = 0;
		i = 0;
	}
	jx9_result_string(pCtx, "", 0); /* Set an empty stirng */
	/* Start the 'join' process */
	while( i < nArg ){
		if( jx9_value_is_json_array(apArg[i]) ){
			/* Iterate throw array entries */
			jx9_array_walk(apArg[i], implode_callback, &imp_data);
		}else{
			const char *zData;
			int nLen;
			/* Extract the string representation of the jx9 value */
			zData = jx9_value_to_string(apArg[i], &nLen);
			if( nLen > 0 ){
				if( imp_data.nSeplen > 0 ){
					if( !imp_data.bFirst ){
						/* append the separator first */
						jx9_result_string(pCtx, imp_data.zSep, imp_data.nSeplen);
					}else{
						imp_data.bFirst = 0;
					}
				}
				jx9_result_string(pCtx, zData, nLen);
			}
		}
		i++;
	}
	return JX9_OK;
}